

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O3

void __thiscall
AppParametersTest_double_value_Test::TestBody(AppParametersTest_double_value_Test *this)

{
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  *ppVar1;
  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> uVar2;
  byte bVar3;
  long lVar4;
  long *plVar5;
  object *poVar6;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar7;
  char *pcVar8;
  pointer *__ptr;
  bool bVar9;
  initializer_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
  __l_00;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  expected_values;
  object obj;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  expected_args;
  ArgWrapper<char> args;
  app_parameters parameters;
  long *local_300;
  less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  local_2f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  local_2e8;
  undefined1 local_2b8 [72];
  AssertHelper local_270 [8];
  undefined1 local_268 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_258;
  undefined1 local_248 [48];
  undefined1 local_218 [16];
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  local_208;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_1a8;
  ArgWrapper<char> local_190;
  app_parameters local_170 [336];
  
  ArgWrapper<char>::ArgWrapper<char_const*,char_const*,char_const*,char_const*,char_const*>
            (&local_190,"/path/to/exe","-key","value","--key2","value2");
  uVar2._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
       local_190.m_argv._M_t.
       super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (local_170,
             (int)((ulong)((long)local_190.m_args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_190.m_args.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5),
             (char **)uVar2._M_t.
                      super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
                      .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                      super__Head_base<0UL,_const_char_**,_false>._M_head_impl,(char **)0x0,
             (unordered_set *)local_268);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_268);
  lVar4 = jessilib::app_parameters::name_abi_cxx11_();
  bVar9 = *(long *)(lVar4 + 8) != 0;
  local_2b8[0] = bVar9;
  local_2b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_268,local_2b8,"parameters.name().empty()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xf1,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
    }
    if ((long *)local_2e8._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_impl._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_2b8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2b8._8_8_);
    }
  }
  plVar5 = (long *)jessilib::app_parameters::arguments_abi_cxx11_();
  local_2b8._0_8_ = plVar5[1] - *plVar5 >> 5;
  local_2e8._M_impl._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_268,"parameters.arguments().size()","4U",(unsigned_long *)local_2b8,
             (uint *)&local_2e8);
  if (local_268[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_260._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_260._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xf2,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((void *)local_2b8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_2b8._0_8_ + 8))();
    }
  }
  if (local_260._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_260,local_260._M_head_impl);
  }
  plVar5 = (long *)jessilib::app_parameters::switches();
  local_2b8._0_8_ = plVar5[1] - *plVar5 >> 4;
  local_2e8._M_impl._0_8_ = local_2e8._M_impl._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_268,"parameters.switches().size()","0U",(unsigned_long *)local_2b8,
             (uint *)&local_2e8);
  if (local_268[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_260._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xf3,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((void *)local_2b8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_2b8._0_8_ + 8))();
    }
  }
  if (local_260._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_260,local_260._M_head_impl);
  }
  lVar4 = jessilib::app_parameters::switches_set();
  local_2b8._0_8_ = *(undefined8 *)(lVar4 + 0x18);
  local_2e8._M_impl._0_8_ = local_2e8._M_impl._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_268,"parameters.switches_set().size()","0U",
             (unsigned_long *)local_2b8,(uint *)&local_2e8);
  if (local_268[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_260._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xf4,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((void *)local_2b8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_2b8._0_8_ + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_260._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_260,local_260._M_head_impl);
  }
  jessilib::app_parameters::values();
  local_2e8._M_impl._0_8_ = local_258._8_8_;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_2b8,"parameters.values().size()","2U",(unsigned_long *)&local_2e8,
             (uint *)&local_1a8);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_268);
  if ((bool)local_2b8[0] == false) {
    testing::Message::Message((Message *)local_268);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xf5,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2b8._8_8_);
  }
  jessilib::app_parameters::as_object();
  local_268 = (undefined1  [8])&local_258;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_268,"-key","");
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_248,"value","");
  local_248._32_8_ = local_218;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)(local_248 + 0x20),"--key2","");
  paVar7 = &local_208.first.field_2;
  local_208.first._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_208,"value2","");
  __l._M_len = 4;
  __l._M_array = (iterator)local_268;
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::vector(&local_1a8,__l,(allocator_type *)&local_2e8);
  lVar4 = -0x80;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)(&paVar7->_M_allocated_capacity + -4);
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  std::
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  ::pair<const_char8_t_(&)[4],_const_char8_t_(&)[6],_true>
            ((pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
              *)local_268,(char8_t (*) [4])0x476187,(char8_t (*) [6])0x46cadb);
  std::
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  ::pair<const_char8_t_(&)[5],_const_char8_t_(&)[7],_true>
            (&local_208,(char8_t (*) [5])0x476240,(char8_t (*) [7])0x47625c);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_268;
  std::
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::map((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
         *)&local_2e8,__l_00,local_2f8,(allocator_type *)&local_300);
  lVar4 = -0xc0;
  ppVar1 = &local_208;
  do {
    poVar6 = &ppVar1->second;
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                         *)poVar6);
    if ((void *)((long)(poVar6 + -1) + 0x30) != *(void **)((long)(poVar6 + -1) + 0x20)) {
      operator_delete(*(void **)((long)(poVar6 + -1) + 0x20),
                      *(long *)((long)(poVar6 + -1) + 0x30) + 1);
    }
    ppVar1 = (pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
              *)(poVar6 + -2);
    lVar4 = lVar4 + 0x60;
  } while (lVar4 != 0);
  bVar3 = jessilib::object::null();
  local_2f8[0] = (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                  )(bVar3 ^ 1);
  local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_268,(char *)local_2f8,"obj.null()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xfa,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_270,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(local_270);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
    }
    if (local_300 != (long *)0x0) {
      (**(code **)(*local_300 + 8))();
    }
    if (local_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f0,local_2f0);
    }
  }
  local_268 = (undefined1  [8])&local_258;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_268,"Name","");
  poVar6 = (object *)jessilib::object::operator[]((u8string *)local_2b8);
  testing::internal::CmpHelperEQ<jessilib::object,char8_t[13]>
            ((internal *)local_2f8,"obj[u8\"Name\"]","u8\"/path/to/exe\"",poVar6,
             (char8_t (*) [13])"/path/to/exe");
  if (local_268 != (undefined1  [8])&local_258) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
  }
  if (local_2f8[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xfb,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,local_2f0);
  }
  local_268 = (undefined1  [8])&local_258;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_268,"Args","");
  poVar6 = (object *)jessilib::object::operator[]((u8string *)local_2b8);
  testing::internal::
  CmpHelperEQ<jessilib::object,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_2f8,"obj[u8\"Args\"]","expected_args",poVar6,&local_1a8);
  if (local_268 != (undefined1  [8])&local_258) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
  }
  if (local_2f8[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xfc,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,local_2f0);
  }
  local_268 = (undefined1  [8])&local_258;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_268,"Values","");
  poVar6 = (object *)jessilib::object::operator[]((u8string *)local_2b8);
  testing::internal::
  CmpHelperEQ<jessilib::object,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
            ((internal *)local_2f8,"obj[u8\"Values\"]","expected_values",poVar6,
             (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
              *)&local_2e8);
  if (local_268 != (undefined1  [8])&local_258) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
  }
  if (local_2f8[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xfd,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,local_2f0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::~_Rb_tree(&local_2e8);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_1a8);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_2b8);
  jessilib::app_parameters::~app_parameters(local_170);
  if ((tuple<const_char_**,_std::default_delete<const_char_*[]>_>)
      local_190.m_argv._M_t.
      super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
      super__Head_base<0UL,_const_char_**,_false>._M_head_impl !=
      (_Head_base<0UL,_const_char_**,_false>)0x0) {
    operator_delete__((void *)local_190.m_argv._M_t.
                              super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>
                              .super__Head_base<0UL,_const_char_**,_false>._M_head_impl);
  }
  local_190.m_argv._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
  _M_t.super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
       (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)
       (__uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190.m_args);
  return;
}

Assistant:

TEST(AppParametersTest, double_value) {
	ArgWrapper args{ "/path/to/exe", "-key", "value", "--key2", "value2" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 4U);
	EXPECT_EQ(parameters.switches().size(), 0U);
	EXPECT_EQ(parameters.switches_set().size(), 0U);
	EXPECT_EQ(parameters.values().size(), 2U);

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"-key", u8"value", u8"--key2", u8"value2" };
	std::map<std::u8string, object> expected_values{ { u8"key", u8"value" }, { u8"key2", u8"value2" } };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Values"], expected_values);
}